

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O0

int __thiscall
Saturation::PredicateSplitPassiveClauseContainer::remove
          (PredicateSplitPassiveClauseContainer *this,char *__filename)

{
  Clause *pCVar1;
  pointer pPVar2;
  PredicateSplitPassiveClauseContainer *extraout_RAX;
  uint i;
  uint bestQueueIndex;
  Clause *in_stack_ffffffffffffffd8;
  uint local_18;
  float in_stack_ffffffffffffffec;
  
  (*(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
    _vptr_ClauseContainer[0x14])(this,__filename);
  local_18 = bestQueue((PredicateSplitPassiveClauseContainer *)__filename,in_stack_ffffffffffffffec)
  ;
  if ((this->_layeredArrangement & 1U) == 0) {
    std::
    vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
    ::operator[](&this->_queues,(ulong)local_18);
    pPVar2 = std::
             unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
             ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                           *)0xac97c9);
    (*(pPVar2->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[4])
              (pPVar2,__filename);
  }
  else {
    while( true ) {
      in_stack_ffffffffffffffd8 = (Clause *)(ulong)local_18;
      pCVar1 = (Clause *)
               std::
               vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ::size(&this->_queues);
      if (pCVar1 <= in_stack_ffffffffffffffd8) break;
      std::
      vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
      ::operator[](&this->_queues,(ulong)local_18);
      pPVar2 = std::
               unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
               ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                             *)0xac978d);
      (*(pPVar2->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[4])
                (pPVar2,__filename);
      local_18 = local_18 + 1;
    }
  }
  if (((this->super_PassiveClauseContainer)._isOutermost & 1U) != 0) {
    Lib::SingleParamEvent<Kernel::Clause_*>::fire
              ((SingleParamEvent<Kernel::Clause_*> *)this,in_stack_ffffffffffffffd8);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void PredicateSplitPassiveClauseContainer::remove(Clause* cl)
{
  if (_isOutermost)
  {
    ASS(cl->store()==Clause::PASSIVE);
  }
  auto bestQueueIndex = bestQueue(evaluateFeature(cl));

  if (_layeredArrangement)
  {
    // remove clause from all queues starting from best queue for clause
    for (unsigned i = bestQueueIndex; i < _queues.size(); i++)
    {
      _queues[i]->remove(cl);
    }
  }
  else
  {
    // remove clause from best queue for clause
    _queues[bestQueueIndex]->remove(cl);
  }

  if (_isOutermost)
  {
    ASS(cl->store()==Clause::PASSIVE);
    removedEvent.fire(cl);
    ASS(cl->store() != Clause::PASSIVE);
  }
}